

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

void __thiscall wallet::SQLiteBatch::Close(SQLiteBatch *this)

{
  string_view source_file;
  bool bVar1;
  bool bVar2;
  int iVar3;
  Logger *pLVar4;
  char *in_R8;
  pointer ppVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file_00;
  string_view source_file_01;
  initializer_list<std::pair<sqlite3_stmt_**,_const_char_*>_> __l;
  string_view str;
  string_view logging_function_01;
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  statements;
  string log_msg;
  Level in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *local_130;
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  sqlite3_stmt **local_e8;
  char *local_e0;
  sqlite3_stmt **local_d8;
  char *local_d0;
  sqlite3_stmt **local_c8;
  char *local_c0;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_txn == true) {
    iVar3 = (*(this->super_DatabaseBatch)._vptr_DatabaseBatch[0xd])(this);
    if ((char)iVar3 == '\0') {
      in_R8 = (char *)0x1a5;
      logging_function_00._M_str = "Close";
      logging_function_00._M_len = 5;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file_01._M_len = 0x5a;
      LogPrintf_<>(logging_function_00,source_file_01,0x1a5,
                   I2P|QT|LIBEVENT|PRUNE|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|RPC|WALLETDB|
                   ZMQ|HTTP,in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
      bVar1 = true;
      goto LAB_001c6290;
    }
    in_R8 = (char *)0x19f;
    logging_function._M_str = "Close";
    logging_function._M_len = 5;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file_00._M_len = 0x5a;
    LogPrintf_<>(logging_function,source_file_00,0x19f,
                 I2P|QT|LIBEVENT|PRUNE|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|RPC|TOR,
                 in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0);
  }
  bVar1 = false;
LAB_001c6290:
  local_108._M_dataplus._M_p = (pointer)&this->m_read_stmt;
  local_108._M_string_length = 0x4a7f3e;
  local_108.field_2._M_allocated_capacity = (size_type)&this->m_insert_stmt;
  local_108.field_2._8_8_ = (long)"basic_string::insert" + 0xe;
  local_e8 = &this->m_overwrite_stmt;
  local_e0 = "overwrite";
  local_d8 = &this->m_delete_stmt;
  local_d0 = "delete";
  local_c8 = &this->m_delete_prefix_stmt;
  local_c0 = "delete prefix";
  __l._M_len = 5;
  __l._M_array = (iterator)&local_108;
  std::
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  ::vector(&local_128,__l,(allocator_type *)&local_58);
  if (local_128.
      super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_128.
      super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar5 = local_128.
             super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar3 = sqlite3_finalize(*ppVar5->first);
      if (iVar3 != 0) {
        local_130 = (char *)sqlite3_errstr(iVar3);
        pLVar4 = LogInstance();
        bVar2 = BCLog::Logger::Enabled(pLVar4);
        if (bVar2) {
          local_108._M_string_length = 0;
          local_108.field_2._M_allocated_capacity =
               local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          tinyformat::format<char_const*,char_const*>
                    (&local_58,
                     (tinyformat *)
                     "SQLiteBatch: Batch closed but could not finalize %s statement: %s\n",
                     (char *)&ppVar5->second,&local_130,(char **)in_R8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_108,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          pLVar4 = LogInstance();
          local_58._M_dataplus._M_p = (pointer)0x5a;
          local_58._M_string_length = 0x4a74cc;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
          ;
          source_file._M_len = 0x5a;
          str._M_str = local_108._M_dataplus._M_p;
          str._M_len = local_108._M_string_length;
          logging_function_01._M_str = "Close";
          logging_function_01._M_len = 5;
          in_R8 = "Close";
          BCLog::Logger::LogPrintStr(pLVar4,str,logging_function_01,source_file,0x1b6,ALL,Info);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,
                            (ulong)(local_108.field_2._M_allocated_capacity + 1));
          }
        }
      }
      *ppVar5->first = (sqlite3_stmt *)0x0;
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != local_128.
                       super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (bVar1) {
    (*(this->m_database->super_WalletDatabase)._vptr_WalletDatabase[8])();
    (*(this->m_database->super_WalletDatabase)._vptr_WalletDatabase[2])();
    CSemaphore::post(&this->m_database->m_write_semaphore);
  }
  if (local_128.
      super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SQLiteBatch::Close()
{
    bool force_conn_refresh = false;

    // If we began a transaction, and it wasn't committed, abort the transaction in progress
    if (m_txn) {
        if (TxnAbort()) {
            LogPrintf("SQLiteBatch: Batch closed unexpectedly without the transaction being explicitly committed or aborted\n");
        } else {
            // If transaction cannot be aborted, it means there is a bug or there has been data corruption. Try to recover in this case
            // by closing and reopening the database. Closing the database should also ensure that any changes made since the transaction
            // was opened will be rolled back and future transactions can succeed without committing old data.
            force_conn_refresh = true;
            LogPrintf("SQLiteBatch: Batch closed and failed to abort transaction, resetting db connection..\n");
        }
    }

    // Free all of the prepared statements
    const std::vector<std::pair<sqlite3_stmt**, const char*>> statements{
        {&m_read_stmt, "read"},
        {&m_insert_stmt, "insert"},
        {&m_overwrite_stmt, "overwrite"},
        {&m_delete_stmt, "delete"},
        {&m_delete_prefix_stmt, "delete prefix"},
    };

    for (const auto& [stmt_prepared, stmt_description] : statements) {
        int res = sqlite3_finalize(*stmt_prepared);
        if (res != SQLITE_OK) {
            LogPrintf("SQLiteBatch: Batch closed but could not finalize %s statement: %s\n",
                      stmt_description, sqlite3_errstr(res));
        }
        *stmt_prepared = nullptr;
    }

    if (force_conn_refresh) {
        m_database.Close();
        try {
            m_database.Open();
            // If TxnAbort failed and we refreshed the connection, the semaphore was not released, so release it here to avoid deadlocks on future writes.
            m_database.m_write_semaphore.post();
        } catch (const std::runtime_error&) {
            // If open fails, cleanup this object and rethrow the exception
            m_database.Close();
            throw;
        }
    }
}